

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word.c
# Opt level: O3

int lowerword(int f,int n)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  RSIZE size;
  
  iVar3 = checkdirty(curbp);
  if (iVar3 == 1) {
    if ((curbp->b_flag & 0x10U) == 0) {
      if (n < 0) {
        iVar3 = 0;
      }
      else {
        if (n != 0) {
          do {
            n = n + -1;
            while( true ) {
              if ((curwp->w_doto != curwp->w_dotp->l_used) &&
                 ((cinfo[(byte)curwp->w_dotp->l_text[curwp->w_doto]] & 1U) != 0)) break;
              iVar3 = forwchar(8,1);
              if (iVar3 == 0) {
                return 1;
              }
            }
            size = countfword();
            undo_add_change(curwp->w_dotp,curwp->w_doto,size);
            while( true ) {
              iVar3 = curwp->w_doto;
              if (iVar3 == curwp->w_dotp->l_used) break;
              pcVar2 = curwp->w_dotp->l_text;
              bVar1 = pcVar2[iVar3];
              if ((cinfo[bVar1] & 1U) == 0) break;
              if ((cinfo[bVar1] & 2U) != 0) {
                pcVar2[iVar3] = bVar1 + 0x20;
                lchange(8);
              }
              iVar3 = forwchar(8,1);
              if (iVar3 == 0) {
                return 1;
              }
            }
          } while (n != 0);
        }
        iVar3 = 1;
      }
    }
    else {
      dobeep();
      iVar3 = 0;
      ewprintf("Buffer is read-only");
    }
  }
  return iVar3;
}

Assistant:

int
lowerword(int f, int n)
{
	int	c, s;
	RSIZE	size;

	if ((s = checkdirty(curbp)) != TRUE)
		return (s);
	if (curbp->b_flag & BFREADONLY) {
		dobeep();
		ewprintf("Buffer is read-only");
		return (FALSE);
	}
	if (n < 0)
		return (FALSE);
	while (n--) {
		while (inword() == FALSE) {
			if (forwchar(FFRAND, 1) == FALSE)
				return (TRUE);
		}
		size = countfword();
		undo_add_change(curwp->w_dotp, curwp->w_doto, size);

		while (inword() != FALSE) {
			c = lgetc(curwp->w_dotp, curwp->w_doto);
			if (ISUPPER(c) != FALSE) {
				c = TOLOWER(c);
				lputc(curwp->w_dotp, curwp->w_doto, c);
				lchange(WFFULL);
			}
			if (forwchar(FFRAND, 1) == FALSE)
				return (TRUE);
		}
	}
	return (TRUE);
}